

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall
doctest::detail::
stringifyBinaryExpr<std::forward_list<char,std::allocator<char>>,std::forward_list<char,std::allocator<char>>>
          (String *__return_storage_ptr__,detail *this,
          forward_list<char,_std::allocator<char>_> *lhs,char *op,
          forward_list<char,_std::allocator<char>_> *rhs)

{
  String local_98;
  String local_70;
  String local_58;
  String local_40;
  forward_list<char,_std::allocator<char>_> *local_28;
  forward_list<char,_std::allocator<char>_> *rhs_local;
  char *op_local;
  forward_list<char,_std::allocator<char>_> *lhs_local;
  
  local_28 = (forward_list<char,_std::allocator<char>_> *)op;
  rhs_local = lhs;
  op_local = (char *)this;
  lhs_local = (forward_list<char,_std::allocator<char>_> *)__return_storage_ptr__;
  toString<std::forward_list<char,_std::allocator<char>_>,_true>
            (&local_58,(forward_list<char,_std::allocator<char>_> *)this);
  String::String(&local_70,(char *)rhs_local);
  doctest::operator+(&local_40,&local_58,&local_70);
  toString<std::forward_list<char,_std::allocator<char>_>,_true>(&local_98,local_28);
  doctest::operator+(__return_storage_ptr__,&local_40,&local_98);
  String::~String(&local_98);
  String::~String(&local_40);
  String::~String(&local_70);
  String::~String(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }